

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_compute_cardinality(bitset_container_t *bitset)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t in_stack_00000b08;
  __m256i *in_stack_00000b10;
  bitset_container_t *bitset_local;
  
  _Var1 = croaring_avx2();
  if (_Var1) {
    uVar2 = avx2_harley_seal_popcount256(in_stack_00000b10,in_stack_00000b08);
    bitset_local._4_4_ = (int)uVar2;
  }
  else {
    bitset_local._4_4_ = _scalar_bitset_container_compute_cardinality(bitset);
  }
  return bitset_local._4_4_;
}

Assistant:

int bitset_container_compute_cardinality(const bitset_container_t *bitset) {
    if( croaring_avx2() ) {
      return (int) avx2_harley_seal_popcount256(
        (const __m256i *)bitset->words,
        BITSET_CONTAINER_SIZE_IN_WORDS / (WORDS_IN_AVX2_REG));
    } else {
      return _scalar_bitset_container_compute_cardinality(bitset);

    }
}